

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

bool __thiscall ON_Xform::IsAffine(ON_Xform *this)

{
  double *pdVar1;
  bool local_11;
  ON_Xform *this_local;
  
  local_11 = false;
  if ((this->m_xform[3][0] == 0.0) && (!NAN(this->m_xform[3][0]))) {
    pdVar1 = this->m_xform[3] + 1;
    local_11 = false;
    if ((*pdVar1 == 0.0) && (!NAN(*pdVar1))) {
      pdVar1 = this->m_xform[3] + 2;
      local_11 = false;
      if ((*pdVar1 == 0.0) && (!NAN(*pdVar1))) {
        pdVar1 = this->m_xform[3] + 3;
        local_11 = false;
        if ((*pdVar1 == 1.0) && (!NAN(*pdVar1))) {
          local_11 = IsValid(this);
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool ON_Xform::IsAffine() const
{
  return (
    0.0 == m_xform[3][0] 
    && 0.0 == m_xform[3][1] 
    && 0.0 == m_xform[3][2] 
    && 1.0 == m_xform[3][3] 
    && IsValid());
}